

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int udp_ep_get_remaddr(void *arg,void *v,size_t *szp,nni_opt_type t)

{
  undefined1 local_c8 [8];
  nng_sockaddr sa;
  void *pvStack_38;
  int rv;
  udp_ep *ep;
  size_t *psStack_28;
  nni_opt_type t_local;
  size_t *szp_local;
  void *v_local;
  void *arg_local;
  
  if ((*(byte *)((long)arg + 1000) & 1) == 0) {
    arg_local._4_4_ = 9;
  }
  else {
    pvStack_38 = arg;
    ep._4_4_ = t;
    psStack_28 = szp;
    szp_local = (size_t *)v;
    v_local = arg;
    memcpy(local_c8,(void *)((long)arg + 0x8e0),0x88);
    arg_local._4_4_ = nni_copyout_sockaddr((nng_sockaddr *)local_c8,szp_local,psStack_28,ep._4_4_);
  }
  return arg_local._4_4_;
}

Assistant:

static int
udp_ep_get_remaddr(void *arg, void *v, size_t *szp, nni_opt_type t)
{
	udp_ep      *ep = arg;
	int          rv;
	nng_sockaddr sa;

	if (!ep->dialer) {
		return (NNG_ENOTSUP);
	}
	sa = ep->peer_sa;

	rv = nni_copyout_sockaddr(&sa, v, szp, t);
	return (rv);
}